

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O1

uint32_t * gravity_bytecode_deserialize(char *buffer,size_t len,uint32_t *n)

{
  char cVar1;
  uint uVar2;
  bool bVar3;
  uint32_t *__ptr;
  ulong uVar4;
  uint32_t uVar5;
  long lVar6;
  int iVar7;
  
  uVar2 = (uint)(len >> 3) & 0x1fffffff;
  __ptr = (uint32_t *)gravity_calloc((gravity_vm *)0x0,1,(ulong)(uVar2 * 4 + 4));
  if (7 < (uint)len) {
    uVar4 = 0;
    do {
      lVar6 = 0;
      uVar5 = 0;
      do {
        cVar1 = buffer[lVar6];
        iVar7 = -0x37;
        if (((byte)(cVar1 + 0xbfU) < 6) || (iVar7 = -0x30, (byte)(cVar1 - 0x30U) < 10)) {
          uVar5 = uVar5 << 4 | iVar7 + cVar1;
          iVar7 = 0;
          bVar3 = true;
        }
        else {
          iVar7 = 8;
          bVar3 = false;
        }
        if (!bVar3) goto LAB_00137d49;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 8);
      iVar7 = 5;
LAB_00137d49:
      if (iVar7 == 5) {
        __ptr[uVar4] = uVar5;
        iVar7 = 0;
      }
      if (iVar7 != 0) goto LAB_00137d6c;
      uVar4 = uVar4 + 1;
      buffer = buffer + 8;
    } while (uVar4 != uVar2 + ((len >> 3 & 0x1fffffff) == 0));
  }
  iVar7 = 2;
LAB_00137d6c:
  if (iVar7 == 8) {
    *n = 0;
    if (__ptr != (uint32_t *)0x0) {
      free(__ptr);
    }
    __ptr = (uint32_t *)0x0;
  }
  else if (iVar7 == 2) {
    *n = uVar2;
  }
  return __ptr;
}

Assistant:

uint32_t *gravity_bytecode_deserialize (const char *buffer, size_t len, uint32_t *n) {
    uint32_t ninst = (uint32_t)len / 8;
    uint32_t *bytecode = (uint32_t *)mem_alloc(NULL, sizeof(uint32_t) * (ninst + 1));    // +1 to get a 0 terminated bytecode (0 is opcode RET0)

    for (uint32_t j=0; j<ninst; ++j) {
        register uint32_t v = 0;

        for (uint32_t i=(j*8); i<=(j*8)+7; ++i) {
            // I was using a conversion code from
            // https://code.google.com/p/yara-project/source/browse/trunk/libyara/xtoi.c?r=150
            // but it caused issues under ARM processor so I decided to switch to an easier to read/maintain code
            // http://codereview.stackexchange.com/questions/42976/hexadecimal-to-integer-conversion-function

            // no needs to have also the case:
            // if (c >= 'a' && c <= 'f') {
            //        c = c - 'a' + 10;
            // }
            // because bytecode is always uppercase
            register uint32_t c = buffer[i];

            if (c >= 'A' && c <= 'F') {
                c = c - 'A' + 10;
            } else if (c >= '0' && c <= '9') {
                c -= '0';
            } else goto abort_conversion;

            v = v << 4 | c;

        }

        bytecode[j] = v;
    }

    *n = ninst;
    return bytecode;

abort_conversion:
    *n = 0;
    if (bytecode) mem_free(bytecode);
    return NULL;
}